

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

cupdlp_retcode PDHG_Create(CUPDLPwork **ww,CUPDLPproblem *lp,CUPDLPscaling *scaling)

{
  CUPDLPwork *pCVar1;
  
  pCVar1 = (CUPDLPwork *)calloc(1,0x60);
  *ww = pCVar1;
  if (pCVar1 != (CUPDLPwork *)0x0) {
    pCVar1->problem = lp;
    pCVar1->scaling = scaling;
  }
  return (uint)(pCVar1 == (CUPDLPwork *)0x0);
}

Assistant:

cupdlp_retcode PDHG_Create(CUPDLPwork **ww, CUPDLPproblem *lp,
                           CUPDLPscaling *scaling) {
  cupdlp_retcode retcode = RETCODE_OK;
  CUPDLP_INIT_ZERO_CUPDLP_WORK(*ww, 1);

  CUPDLPwork *w = *ww;
  w->problem = lp;
  w->scaling = scaling;

exit_cleanup:
  return retcode;
}